

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__setsockopt_maybe_char(uv_udp_t *handle,int option,int val)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int arg;
  undefined1 local_1c [24];
  int local_4;
  
  if ((in_EDX < 0) || (0xff < in_EDX)) {
    local_4 = -0x16;
  }
  else {
    iVar1 = setsockopt(*(int *)(in_RDI + 0x80),0,in_ESI,local_1c,4);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
  }
  return local_4;
}

Assistant:

static int uv__setsockopt_maybe_char(uv_udp_t* handle, int option, int val) {
#if defined(__sun)
  char arg = val;
#else
  int arg = val;
#endif

  if (val < 0 || val > 255)
    return -EINVAL;

  if (setsockopt(handle->io_watcher.fd, IPPROTO_IP, option, &arg, sizeof(arg)))
    return -errno;

  return 0;
}